

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_context_get_device_info_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pInfo,int endOfList,void *pUserData)

{
  char cVar1;
  ma_uint32 mVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 uVar7;
  long lVar8;
  
  if (endOfList < 1) {
    if (pUserData == (void *)0x0) {
      __assert_fail("pData != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4b0c,
                    "void ma_context_get_device_info_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
                   );
    }
    *(undefined4 *)((long)pUserData + 8) = 1;
    pcVar3 = pInfo->name;
    lVar4 = *pUserData;
    if (pcVar3 != (char *)0x0) {
      if (lVar4 == 0) {
        lVar4 = 0;
      }
      else {
        lVar8 = 0;
        do {
          cVar1 = pcVar3[lVar8];
          if (cVar1 == '\0') goto LAB_0010e461;
          *(char *)(lVar4 + lVar8) = cVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xff);
        lVar8 = 0xff;
LAB_0010e461:
        *(undefined1 *)(lVar4 + lVar8) = 0;
        lVar4 = *pUserData;
      }
    }
    pcVar3 = pInfo->description;
    if (pcVar3 != (char *)0x0) {
      lVar8 = 0;
      do {
        cVar1 = pcVar3[lVar8];
        if (cVar1 == '\0') goto LAB_0010e499;
        *(char *)(lVar4 + 0x100 + lVar8) = cVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0xff);
      lVar8 = 0xff;
LAB_0010e499:
      *(undefined1 *)(lVar4 + 0x100 + lVar8) = 0;
      lVar4 = *pUserData;
    }
    uVar5 = (uint)(pInfo->sample_spec).channels;
    *(uint *)(lVar4 + 0x21c) = uVar5;
    *(uint *)(lVar4 + 0x220) = uVar5;
    mVar2 = (pInfo->sample_spec).rate;
    *(ma_uint32 *)(lVar4 + 0x224) = mVar2;
    *(ma_uint32 *)(lVar4 + 0x228) = mVar2;
    *(undefined4 *)(lVar4 + 0x200) = 1;
    uVar6 = (ulong)(uint)(pInfo->sample_spec).format;
    uVar7 = 0;
    if (uVar6 < 10) {
      uVar7 = *(undefined4 *)(&DAT_00116010 + uVar6 * 4);
    }
    *(undefined4 *)(lVar4 + 0x204) = uVar7;
  }
  return;
}

Assistant:

static void ma_context_get_device_info_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pInfo, int endOfList, void* pUserData)
{
    ma_context_get_device_info_callback_data__pulse* pData = (ma_context_get_device_info_callback_data__pulse*)pUserData;

    if (endOfList > 0) {
        return;
    }

    MA_ASSERT(pData != NULL);
    pData->foundDevice = MA_TRUE;

    if (pInfo->name != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->id.pulse, sizeof(pData->pDeviceInfo->id.pulse), pInfo->name, (size_t)-1);
    }

    if (pInfo->description != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pInfo->description, (size_t)-1);
    }

    pData->pDeviceInfo->minChannels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->maxChannels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->minSampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->maxSampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->formatCount = 1;
    pData->pDeviceInfo->formats[0] = ma_format_from_pulse(pInfo->sample_spec.format);

    (void)pPulseContext; /* Unused. */
}